

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

size_t xmlBufShrink(xmlBufPtr buf,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (buf == (xmlBufPtr)0x0) {
    return 0;
  }
  sVar2 = 0;
  if ((len != 0) && ((buf->flags & 3) == 0)) {
    uVar3 = (ulong)buf->compat_size;
    uVar1 = buf->size;
    if (buf->size != uVar3 && uVar3 < 0x7fffffff) {
      buf->size = uVar3;
      uVar1 = uVar3;
    }
    uVar4 = (ulong)buf->compat_use;
    uVar3 = buf->use;
    if (buf->use != uVar4 && uVar4 < 0x7fffffff) {
      buf->use = uVar4;
      uVar3 = uVar4;
    }
    uVar4 = uVar3 - len;
    if (uVar3 < len) {
      return 0;
    }
    buf->use = uVar4;
    buf->content = buf->content + len;
    uVar1 = uVar1 - len;
    buf->size = uVar1;
    if (0x7ffffffe < uVar1) {
      uVar1 = 0x7fffffff;
    }
    buf->compat_size = (uint)uVar1;
    uVar1 = 0x7fffffff;
    if (uVar4 < 0x7fffffff) {
      uVar1 = uVar4;
    }
    buf->compat_use = (uint)uVar1;
    sVar2 = len;
  }
  return sVar2;
}

Assistant:

size_t
xmlBufShrink(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)))
        return(0);
    if (len == 0)
        return(0);
    CHECK_COMPAT(buf)

    if (len > buf->use)
        return(0);

    buf->use -= len;
    buf->content += len;
    buf->size -= len;

    UPDATE_COMPAT(buf)
    return(len);
}